

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pragma_statement.cpp
# Opt level: O2

void __thiscall duckdb::PragmaStatement::PragmaStatement(PragmaStatement *this)

{
  SQLStatement::SQLStatement(&this->super_SQLStatement,PRAGMA_STATEMENT);
  (this->super_SQLStatement)._vptr_SQLStatement = (_func_int **)&PTR__PragmaStatement_02793520;
  make_uniq<duckdb::PragmaInfo>();
  return;
}

Assistant:

PragmaStatement::PragmaStatement() : SQLStatement(StatementType::PRAGMA_STATEMENT), info(make_uniq<PragmaInfo>()) {
}